

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

PCMI VIRTUALFindRegionInformation(UINT_PTR address)

{
  PCMI p_Var1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  p_Var1 = pVirtualMemory;
  if (((pVirtualMemoryLastFound == (PCMI)0x0) || (address < pVirtualMemoryLastFound->startBoundary))
     || (p_Var1 = pVirtualMemoryLastFound, pVirtualMemoryLastFound->startBoundary != address)) {
    for (; (p_Var1 != (PCMI)0x0 && (p_Var1->startBoundary <= address)); p_Var1 = p_Var1->pNext) {
      if (address < p_Var1->startBoundary + p_Var1->memSize) {
        pVirtualMemoryLastFound = p_Var1;
        return p_Var1;
      }
    }
    p_Var1 = (PCMI)0x0;
  }
  return p_Var1;
}

Assistant:

static PCMI VIRTUALFindRegionInformation( IN UINT_PTR address )
{
    PCMI pEntry = NULL;

    TRACE( "VIRTUALFindRegionInformation( %#x )\n", address );

    pEntry = pVirtualMemory;

    if (pVirtualMemoryLastFound && pVirtualMemoryLastFound->startBoundary <= address)
    {
        pEntry = pVirtualMemoryLastFound;
        if (pEntry->startBoundary == address)
        {
            return pEntry;
        }
    }
    else
    {
        pEntry = pVirtualMemory;
    }

    while( pEntry )
    {
        if ( pEntry->startBoundary > address )
        {
            /* Gone past the possible location in the list. */
            pEntry = NULL;
            break;
        }
        if ( pEntry->startBoundary + pEntry->memSize > address )
        {
            break;
        }

        pEntry = pEntry->pNext;
    }

    if (pEntry) pVirtualMemoryLastFound = pEntry;
    return pEntry;
}